

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O0

void userLoop(Simulator *sim)

{
  int iVar1;
  int iVar2;
  MySimulator *local_48;
  int dy;
  int dx;
  bool isDown;
  int y;
  int x;
  MySimulator *msim;
  MySimulator *psim;
  Simulator *sim_local;
  
  if (sim == (Simulator *)0x0) {
    local_48 = (MySimulator *)0x0;
  }
  else {
    local_48 = (MySimulator *)
               __dynamic_cast(sim,&brown::Simulator::typeinfo,&brown::MySimulator::typeinfo,0);
  }
  if (((local_48 != (MySimulator *)0x0) && (r1step < 1)) && (r2step < 1)) {
    if (userLoop::ptIdx < 0x295) {
      if (userLoop::ptIdx != 0) {
        brown::MySimulator::delay(local_48,(long)sim->MAXT);
      }
      iVar1 = (int)state[userLoop::ptIdx][1] / userLoop::scale;
      iVar2 = (int)state[userLoop::ptIdx][2] / userLoop::scale;
      moveLinear(local_48,iVar1 - userLoop::locs[0],iVar2 - userLoop::locs[1],
                 state[userLoop::ptIdx][0] != 0);
      userLoop::ptIdx = userLoop::ptIdx + 1;
      userLoop::locs[0] = iVar1;
      userLoop::locs[1] = iVar2;
    }
    else {
      brown::MySimulator::delay(local_48,0);
    }
  }
  return;
}

Assistant:

static void userLoop(brown::Simulator& sim) {
    auto* psim = dynamic_cast<brown::MySimulator*>(&sim);
    if (!psim) {return;}
    brown::MySimulator& msim = *psim;

    // return if still drawing
    if (r1step > 0 || r2step > 0) {
        return;
    }

    // drawing finished, do nothing
    static constexpr std::size_t ptNum = sizeof(state)/sizeof(state[0]);
    static std::size_t ptIdx = 0;
    if (ptIdx >= ptNum) {
        msim.delay(0);
        return;
    }

    // delay between lines
    if (ptIdx > 0) {
        msim.delay(sim.MAXT);
    }

    // target location [px]
    static int scale = 8;
    int x = state[ptIdx][1]/scale;
    int y = state[ptIdx][2]/scale;
    bool isDown = static_cast<bool>(state[ptIdx][0]);

    // relative linear motion
    static int locs[2]{0, 0};
    int dx = x - locs[0];
    int dy = y - locs[1];
    moveLinear(msim, dx, dy, isDown);

    // update meta
    locs[0] = x; locs[1] = y;
    ptIdx++;
}